

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

CornerIndex __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::GetLeftCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  CornerIndex CVar1;
  undefined4 in_ESI;
  CornerTable *in_RDI;
  CornerIndex prev_corner_id;
  CornerIndex in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffec;
  CornerTable *pCVar2;
  
  pCVar2 = in_RDI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a2eef);
  CornerTable::Previous
            ((CornerTable *)CONCAT44(in_stack_ffffffffffffffec,in_ESI),(CornerIndex)(uint)pCVar2);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a2f14);
  CVar1 = CornerTable::Opposite(in_RDI,in_stack_ffffffffffffffe0);
  return (CornerIndex)CVar1.value_;
}

Assistant:

CornerIndex MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetLeftCorner(
    CornerIndex corner_id) const {
  const CornerIndex prev_corner_id = corner_table_->Previous(corner_id);
  return corner_table_->Opposite(prev_corner_id);
}